

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::delete_root_subtree
          (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *this)

{
  basic_node_ptr<unodb::detail::node_header> node;
  
  node.tagged_ptr = (this->root).tagged_ptr;
  if (node.tagged_ptr != 0) {
    detail::
    basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
    ::delete_subtree(node,this);
  }
  if ((this->node_counts)._M_elems[0] == 0) {
    return;
  }
  __assert_fail("node_counts[as_i<node_type::LEAF>] == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x5bf,
                "void unodb::db<std::span<const std::byte>, std::span<const std::byte>>::delete_root_subtree() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

void db<Key, Value>::delete_root_subtree() noexcept {
  if (root != nullptr) art_policy::delete_subtree(root, *this);

#ifdef UNODB_DETAIL_WITH_STATS
  // It is possible to reset the counter to zero instead of decrementing it for
  // each leaf, but not sure the savings will be significant.
  UNODB_DETAIL_ASSERT(node_counts[as_i<node_type::LEAF>] == 0);
#endif  // UNODB_DETAIL_WITH_STATS
}